

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::FindNextBlocksToDownload
          (PeerManagerImpl *this,Peer *peer,uint count,
          vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *vBlocks,
          NodeId *nodeStaller)

{
  _Base_ptr *state;
  _Rb_tree_header *p_Var1;
  long lVar2;
  NodeId nodeid;
  pointer ppCVar3;
  bool bVar4;
  int iVar5;
  Chainstate *pCVar6;
  optional<arith_uint256> *b;
  CBlockIndex *pCVar7;
  CBlockIndex *pCVar8;
  Logger *this_00;
  Chainstate *pCVar9;
  uint uVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (count != 0) {
    std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::reserve
              (vBlocks,(ulong)count +
                       ((long)(vBlocks->
                              super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(vBlocks->
                              super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3));
    nodeid = peer->m_id;
    p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    p_Var12 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var11 = &p_Var1->_M_header;
    for (; p_Var12 != (_Base_ptr)0x0; p_Var12 = (&p_Var12->_M_left)[*(long *)(p_Var12 + 1) < nodeid]
        ) {
      if (nodeid <= *(long *)(p_Var12 + 1)) {
        p_Var11 = p_Var12;
      }
    }
    p_Var12 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var12 = p_Var11, nodeid < *(long *)(p_Var11 + 1))) {
      p_Var12 = &p_Var1->_M_header;
    }
    state = &p_Var12[1]._M_parent;
    if ((_Rb_tree_header *)p_Var12 == p_Var1) {
      __assert_fail("state != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                    ,0x5e9,
                    "void (anonymous namespace)::PeerManagerImpl::FindNextBlocksToDownload(const Peer &, unsigned int, std::vector<const CBlockIndex *> &, NodeId &)"
                   );
    }
    ProcessBlockAvailability(this,nodeid);
    p_Var11 = *state;
    if (p_Var11 != (_Base_ptr)0x0) {
      pCVar6 = ChainstateManager::ActiveChainstate(this->m_chainman);
      iVar5 = base_uint<256U>::CompareTo
                        ((base_uint<256U> *)&p_Var11[1]._M_parent,
                         &((pCVar6->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>
                        );
      if (-1 < iVar5) {
        p_Var11 = *state;
        b = inline_assertion_check<true,std::optional<arith_uint256>const&>
                      (&(this->m_chainman->m_options).minimum_chain_work,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                       ,0x3d9,"MinimumChainWork","m_options.minimum_chain_work");
        iVar5 = base_uint<256U>::CompareTo
                          ((base_uint<256U> *)&p_Var11[1]._M_parent,(base_uint<256U> *)b);
        if (-1 < iVar5) {
          pCVar7 = ChainstateManager::GetSnapshotBaseBlock(this->m_chainman);
          if ((pCVar7 == (CBlockIndex *)0x0) ||
             (pCVar8 = CBlockIndex::GetAncestor((CBlockIndex *)*state,pCVar7->nHeight),
             pCVar8 == pCVar7)) {
            if ((p_Var12[2]._M_left == (_Base_ptr)0x0) ||
               ((pCVar7 != (CBlockIndex *)0x0 &&
                (*(int *)&(p_Var12[2]._M_left)->_M_right < pCVar7->nHeight)))) {
              pCVar6 = ChainstateManager::ActiveChainstate(this->m_chainman);
              p_Var11 = *state;
              pCVar9 = ChainstateManager::ActiveChainstate(this->m_chainman);
              uVar10 = (int)((ulong)((long)(pCVar9->m_chain).vChain.
                                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pCVar9->m_chain).vChain.
                                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
              if ((int)*(uint *)&p_Var11->_M_right <= (int)uVar10) {
                uVar10 = *(uint *)&p_Var11->_M_right;
              }
              if (((int)uVar10 < 0) ||
                 (ppCVar3 = (pCVar6->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                 (int)((ulong)((long)(pCVar6->m_chain).vChain.
                                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3) >>
                      3) <= (int)uVar10)) {
                pCVar7 = (CBlockIndex *)0x0;
              }
              else {
                pCVar7 = ppCVar3[uVar10];
              }
              p_Var12[2]._M_left = (_Base_ptr)pCVar7;
            }
            pCVar7 = LastCommonAncestor((CBlockIndex *)p_Var12[2]._M_left,(CBlockIndex *)*state);
            p_Var12[2]._M_left = (_Base_ptr)pCVar7;
            if (pCVar7 != (CBlockIndex *)*state) {
              iVar5 = pCVar7->nHeight;
              pCVar6 = ChainstateManager::ActiveChainstate(this->m_chainman);
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                FindNextBlocks(this,vBlocks,peer,(CNodeState *)state,pCVar7,count,iVar5 + 0x400,
                               &pCVar6->m_chain,nodeStaller);
                return;
              }
              goto LAB_0091aa47;
            }
          }
          else {
            this_00 = LogInstance();
            bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
            if (bVar4) {
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                source_file._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                ;
                source_file._M_len = 0x5b;
                logging_function._M_str = "FindNextBlocksToDownload";
                logging_function._M_len = 0x18;
                LogPrintf_<long>(logging_function,source_file,0x5f8,NET,Debug,
                                 "Not downloading blocks from peer=%d, which doesn\'t have the snapshot block in its best chain.\n"
                                 ,&peer->m_id);
                return;
              }
              goto LAB_0091aa47;
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_0091aa47:
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::FindNextBlocksToDownload(const Peer& peer, unsigned int count, std::vector<const CBlockIndex*>& vBlocks, NodeId& nodeStaller)
{
    if (count == 0)
        return;

    vBlocks.reserve(vBlocks.size() + count);
    CNodeState *state = State(peer.m_id);
    assert(state != nullptr);

    // Make sure pindexBestKnownBlock is up to date, we'll need it.
    ProcessBlockAvailability(peer.m_id);

    if (state->pindexBestKnownBlock == nullptr || state->pindexBestKnownBlock->nChainWork < m_chainman.ActiveChain().Tip()->nChainWork || state->pindexBestKnownBlock->nChainWork < m_chainman.MinimumChainWork()) {
        // This peer has nothing interesting.
        return;
    }

    // When we sync with AssumeUtxo and discover the snapshot is not in the peer's best chain, abort:
    // We can't reorg to this chain due to missing undo data until the background sync has finished,
    // so downloading blocks from it would be futile.
    const CBlockIndex* snap_base{m_chainman.GetSnapshotBaseBlock()};
    if (snap_base && state->pindexBestKnownBlock->GetAncestor(snap_base->nHeight) != snap_base) {
        LogDebug(BCLog::NET, "Not downloading blocks from peer=%d, which doesn't have the snapshot block in its best chain.\n", peer.m_id);
        return;
    }

    // Bootstrap quickly by guessing a parent of our best tip is the forking point.
    // Guessing wrong in either direction is not a problem.
    // Also reset pindexLastCommonBlock after a snapshot was loaded, so that blocks after the snapshot will be prioritised for download.
    if (state->pindexLastCommonBlock == nullptr ||
        (snap_base && state->pindexLastCommonBlock->nHeight < snap_base->nHeight)) {
        state->pindexLastCommonBlock = m_chainman.ActiveChain()[std::min(state->pindexBestKnownBlock->nHeight, m_chainman.ActiveChain().Height())];
    }

    // If the peer reorganized, our previous pindexLastCommonBlock may not be an ancestor
    // of its current tip anymore. Go back enough to fix that.
    state->pindexLastCommonBlock = LastCommonAncestor(state->pindexLastCommonBlock, state->pindexBestKnownBlock);
    if (state->pindexLastCommonBlock == state->pindexBestKnownBlock)
        return;

    const CBlockIndex *pindexWalk = state->pindexLastCommonBlock;
    // Never fetch further than the best block we know the peer has, or more than BLOCK_DOWNLOAD_WINDOW + 1 beyond the last
    // linked block we have in common with this peer. The +1 is so we can detect stalling, namely if we would be able to
    // download that next block if the window were 1 larger.
    int nWindowEnd = state->pindexLastCommonBlock->nHeight + BLOCK_DOWNLOAD_WINDOW;

    FindNextBlocks(vBlocks, peer, state, pindexWalk, count, nWindowEnd, &m_chainman.ActiveChain(), &nodeStaller);
}